

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

void __thiscall
bgui::ImageAdapter<unsigned_short>::copyInto
          (ImageAdapter<unsigned_short> *this,ImageU8 *rgb,long x,long y)

{
  mapping mVar1;
  double dVar2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint ir;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double b;
  double g;
  double r;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  uint local_74;
  double local_70;
  ulong local_68;
  double local_60;
  double local_58;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_70 = 1.0;
  local_80 = 1.0 / (this->super_ImageAdapterBase).scale;
  local_88 = (this->super_ImageAdapterBase).imax - (this->super_ImageAdapterBase).imin;
  lVar6 = this->image->width;
  lVar5 = this->image->height;
  local_50 = y;
  if (0.0 < local_88) {
    dVar9 = log(local_88);
    dVar9 = floor(dVar9 / 2.302585092994046);
    local_70 = pow(10.0,dVar9 + -1.0);
  }
  if (((this->super_ImageAdapterBase).rotation & 1) != 0) {
    lVar5 = this->image->width;
    lVar6 = this->image->height;
  }
  iVar3 = this->image->depth;
  local_68 = (ulong)(2 < iVar3);
  uVar4 = (this->super_ImageAdapterBase).channel;
  local_74 = (uint)(2 < iVar3) * 2;
  if (-1 < (int)uVar4 && (int)uVar4 < iVar3) {
    local_68 = (ulong)uVar4;
    local_74 = uVar4;
  }
  ir = 0;
  if (-1 < (int)uVar4 && (int)uVar4 < iVar3) {
    ir = uVar4;
  }
  if (0 < rgb->height) {
    local_58 = (double)lVar5;
    local_60 = (double)x;
    local_98 = (double)lVar6;
    lVar6 = 0;
    dVar9 = local_80;
    do {
      dVar16 = (this->super_ImageAdapterBase).scale;
      dVar2 = (double)(local_50 + lVar6) / dVar16;
      uVar7 = 0;
      if ((0.0 <= dVar2) && (uVar7 = 0, dVar2 < local_58)) {
        dVar16 = local_60 / dVar16;
        uVar7 = 0;
        if (dVar16 < 0.0) {
          uVar7 = 0;
          do {
            if (rgb->width <= (long)uVar7) break;
            (*rgb->img)[lVar6][uVar7] = '\0';
            rgb->img[1][lVar6][uVar7] = '\0';
            rgb->img[2][lVar6][uVar7] = '\0';
            dVar16 = dVar16 + dVar9;
            uVar7 = uVar7 + 1;
          } while (dVar16 < 0.0);
        }
        if (((uint)local_68 == ir) && (mVar1 = (this->super_ImageAdapterBase).map, mVar1 != map_raw)
           ) {
          if (mVar1 == map_jet) {
            if (dVar16 < local_98) {
              uVar7 = uVar7 & 0xffffffff;
              do {
                if (rgb->width <= (long)uVar7) break;
                dVar10 = getPixel(this,(float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                                              (double)(this->super_ImageAdapterBase).R.v[0][0] *
                                              dVar16 + (double)(this->super_ImageAdapterBase).R.v[0]
                                                               [1] * dVar2),
                                  (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                                         (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar16 +
                                         (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar2),
                                  ir);
                dVar9 = (this->super_ImageAdapterBase).imin;
                dVar12 = -0.05;
                iVar3 = extraout_EAX;
                if ((dVar9 <= dVar10) &&
                   (dVar12 = 1.05, dVar10 <= (this->super_ImageAdapterBase).imax)) {
                  dVar12 = (dVar10 - dVar9) / local_88;
                  dVar9 = (this->super_ImageAdapterBase).gamma;
                  if ((dVar9 != 1.0) || (NAN(dVar9))) {
                    iVar3 = (int)(dVar9 + 0.5);
                    if (iVar3 == 2) {
                      if (dVar12 < 0.0) {
                        dVar12 = sqrt(dVar12);
                        iVar3 = extraout_EAX_00;
                      }
                      else {
                        dVar12 = SQRT(dVar12);
                      }
                    }
                    else if (2 < iVar3) {
                      dVar12 = 0.0;
                    }
                  }
                }
                dVar9 = dVar12 / 1.15 + 0.1;
                dVar10 = ABS(dVar9 + -0.75) * -4.0 + 1.5;
                if (1.0 <= dVar10) {
                  dVar10 = 1.0;
                }
                auVar11._0_8_ = ABS(dVar9 + -0.25) * -4.0 + 1.5;
                auVar11._8_8_ = ABS(dVar9 + -0.5) * -4.0 + 1.5;
                auVar11 = minpd(auVar11,_DAT_001526d0);
                dVar9 = auVar11._0_8_;
                dVar12 = auVar11._8_8_;
                auVar14._8_8_ = -(ulong)(0.0 < dVar12);
                auVar14._0_8_ = -(ulong)(0.0 < dVar9);
                uVar4 = movmskpd(iVar3,auVar14);
                if ((uVar4 & 2) == 0) {
                  dVar12 = 0.0;
                }
                if ((uVar4 & 1) == 0) {
                  dVar9 = 0.0;
                }
                if (dVar10 <= 0.0) {
                  dVar10 = 0.0;
                }
                (*rgb->img)[lVar6][uVar7] = (uchar)(int)(dVar10 * 255.0 + 0.5);
                rgb->img[1][lVar6][uVar7] = (uchar)(int)(dVar12 * 255.0 + 0.5);
                rgb->img[2][lVar6][uVar7] = (uchar)(int)(dVar9 * 255.0 + 0.5);
                dVar16 = dVar16 + local_80;
                uVar7 = uVar7 + 1;
                dVar9 = local_80;
              } while (dVar16 < local_98);
            }
          }
          else if ((mVar1 == map_rainbow) && (dVar16 < local_98)) {
            uVar7 = uVar7 & 0xffffffff;
            do {
              if (rgb->width <= (long)uVar7) break;
              dVar10 = getPixel(this,(float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                                            (double)(this->super_ImageAdapterBase).R.v[0][0] *
                                            dVar16 + (double)(this->super_ImageAdapterBase).R.v[0]
                                                             [1] * dVar2),
                                (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                                       (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar16 +
                                       (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar2),ir)
              ;
              local_a8 = (this->super_ImageAdapterBase).imin;
              local_a0 = (this->super_ImageAdapterBase).imax;
              dVar9 = local_a8;
              if (local_a8 <= dVar10) {
                dVar9 = dVar10;
              }
              if (dVar9 <= local_a0) {
                local_a0 = dVar9;
              }
              local_48 = local_a0 / local_70;
              uStack_40 = 0;
              dVar9 = floor(local_48);
              dVar12 = (local_48 - dVar9) * 6.0;
              dVar10 = dVar12 - (double)(int)dVar12;
              dVar9 = 0.0;
              switch((int)dVar12) {
              case 0:
                dVar12 = 1.0;
                break;
              case 1:
                dVar12 = 1.0 - dVar10;
                dVar10 = 1.0;
                break;
              case 2:
                dVar12 = 0.0;
                dVar9 = dVar10;
                dVar10 = 1.0;
                break;
              case 3:
                dVar12 = 0.0;
                dVar9 = 1.0;
                dVar10 = 1.0 - dVar10;
                break;
              case 4:
                dVar12 = dVar10;
                dVar9 = 1.0;
                dVar10 = 0.0;
                break;
              default:
                dVar12 = 1.0;
                dVar9 = 1.0 - dVar10;
                dVar10 = 0.0;
              }
              dVar15 = ((local_a0 - local_a8) * 1.6) / local_88 + -0.8;
              if (0.0 <= dVar15) {
                dVar13 = 1.0 - dVar15;
                dVar12 = dVar12 * dVar13 + dVar15;
                dVar10 = dVar10 * dVar13 + dVar15;
                dVar15 = dVar15 + dVar13 * dVar9;
              }
              else {
                dVar15 = dVar15 + 1.0;
                dVar12 = dVar12 * dVar15;
                dVar10 = dVar10 * dVar15;
                dVar15 = dVar15 * dVar9;
              }
              (*rgb->img)[lVar6][uVar7] = (uchar)(int)(dVar12 * 255.0 + 0.5);
              rgb->img[1][lVar6][uVar7] = (uchar)(int)(dVar10 * 255.0 + 0.5);
              rgb->img[2][lVar6][uVar7] = (uchar)(int)(dVar15 * 255.0 + 0.5);
              dVar16 = dVar16 + local_80;
              uVar7 = uVar7 + 1;
              dVar9 = local_80;
            } while (dVar16 < local_98);
          }
        }
        else if (dVar16 < local_98) {
          uVar7 = uVar7 & 0xffffffff;
          do {
            if (rgb->width <= (long)uVar7) break;
            getPixel(this,&local_90,&local_b0,&local_b8,
                     (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                            (double)(this->super_ImageAdapterBase).R.v[0][0] * dVar16 +
                            (double)(this->super_ImageAdapterBase).R.v[0][1] * dVar2),
                     (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                            (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar16 +
                            (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar2),ir,
                     (int)local_68,local_74);
            dVar9 = (this->super_ImageAdapterBase).imin;
            dVar10 = (this->super_ImageAdapterBase).imax;
            if (dVar10 <= local_90) {
              local_90 = dVar10;
            }
            if (local_90 <= dVar9) {
              local_90 = dVar9;
            }
            local_90 = (local_90 - dVar9) / local_88;
            dVar12 = (double)(~-(ulong)(local_b0 < dVar10) &
                              (ulong)(this->super_ImageAdapterBase).imax |
                             (ulong)local_b0 & -(ulong)(local_b0 < dVar10));
            uVar8 = -(ulong)(dVar9 < dVar12);
            local_b0 = ((double)(~uVar8 & (ulong)(this->super_ImageAdapterBase).imin |
                                uVar8 & (ulong)dVar12) - dVar9) / local_88;
            dVar10 = (double)(~-(ulong)(local_b8 < dVar10) &
                              (ulong)(this->super_ImageAdapterBase).imax |
                             (ulong)local_b8 & -(ulong)(local_b8 < dVar10));
            uVar8 = -(ulong)(dVar9 < dVar10);
            local_b8 = ((double)(~uVar8 & (ulong)(this->super_ImageAdapterBase).imin |
                                uVar8 & (ulong)dVar10) - dVar9) / local_88;
            dVar9 = (this->super_ImageAdapterBase).gamma;
            if ((dVar9 != 1.0) || (NAN(dVar9))) {
              if ((int)(dVar9 + 0.5) == 2) {
                if (local_90 < 0.0) {
                  local_90 = sqrt(local_90);
                }
                else {
                  local_90 = SQRT(local_90);
                }
                if (local_b0 < 0.0) {
                  local_b0 = sqrt(local_b0);
                  dVar9 = local_b8;
                }
                else {
                  local_b0 = SQRT(local_b0);
                  dVar9 = local_b8;
                }
              }
              else {
                if ((int)(dVar9 + 0.5) < 3) goto LAB_00120c28;
                if (local_90 < 0.0) {
                  dVar9 = sqrt(local_90);
                }
                else {
                  dVar9 = SQRT(local_90);
                }
                if (dVar9 < 0.0) {
                  local_90 = sqrt(dVar9);
                }
                else {
                  local_90 = SQRT(dVar9);
                }
                if (local_b0 < 0.0) {
                  dVar9 = sqrt(local_b0);
                }
                else {
                  dVar9 = SQRT(local_b0);
                }
                if (dVar9 < 0.0) {
                  local_b0 = sqrt(dVar9);
                }
                else {
                  local_b0 = SQRT(dVar9);
                }
                if (local_b8 < 0.0) {
                  dVar9 = sqrt(local_b8);
                }
                else {
                  dVar9 = SQRT(local_b8);
                }
              }
              if (dVar9 < 0.0) {
                local_b8 = sqrt(dVar9);
              }
              else {
                local_b8 = SQRT(dVar9);
              }
            }
LAB_00120c28:
            (*rgb->img)[lVar6][uVar7] = (uchar)(int)(local_90 * 255.0 + 0.5);
            rgb->img[1][lVar6][uVar7] = (uchar)(int)(local_b0 * 255.0 + 0.5);
            rgb->img[2][lVar6][uVar7] = (uchar)(int)(local_b8 * 255.0 + 0.5);
            dVar16 = dVar16 + local_80;
            uVar7 = uVar7 + 1;
            dVar9 = local_80;
          } while (dVar16 < local_98);
        }
      }
      for (lVar5 = (long)(int)uVar7; lVar5 < rgb->width; lVar5 = lVar5 + 1) {
        (*rgb->img)[lVar6][lVar5] = '\0';
        rgb->img[1][lVar6][lVar5] = '\0';
        rgb->img[2][lVar6][lVar5] = '\0';
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < rgb->height);
  }
  return;
}

Assistant:

void copyInto(gimage::ImageU8 &rgb, long x, long y) const
    {
      const double step=1/scale;
      const double irange=imax-imin;
      int ir=0, ig=1, ib=2;
      long iw=image->getWidth();
      long ih=image->getHeight();
      double rainbow_size=1;

      if (irange > 0)
      {
        rainbow_size=std::pow(10, std::floor(std::log(irange)/std::log(10))-1);
      }

      if ((rotation&1) != 0)
      {
        iw=image->getHeight();
        ih=image->getWidth();
      }

      assert(rgb.getDepth() == 3);

      if (image->getDepth() < 3)
      {
        ir=ig=ib=0;
      }

      if (channel >= 0 && channel < image->getDepth())
      {
        ir=ig=ib=channel;
      }

      for (int k=0; k<rgb.getHeight(); k++)
      {
        double yf=(y+k)/scale;

        int i=0;

        if (yf >= 0 && yf < ih)
        {
          double xf=x/scale;

          while (xf < 0 && i < rgb.getWidth())
          {
            rgb.set(i, k, 0, 0);
            rgb.set(i, k, 1, 0);
            rgb.set(i, k, 2, 0);

            xf+=step;
            i++;
          }

          if (ig != ir || map == map_raw)
          {
            // map color image or greyscale image directly

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double r, g, b;
              getPixel(r, g, b, xs, ys, ir, ig, ib);

              r=(std::max(imin, std::min(imax, r))-imin)/irange;
              g=(std::max(imin, std::min(imax, g))-imin)/irange;
              b=(std::max(imin, std::min(imax, b))-imin)/irange;

              if (gamma != 1.0)
              {
                // pow() can be extremly slow and linear lookup tables would be
                // very big for data with higher radiometric depth, thats why we
                // only allow a gamma with root of 2 and 4.

                if (static_cast<int>(gamma+0.5) == 2)
                {
                  r=sqrt(r);
                  g=sqrt(g);
                  b=sqrt(b);
                }
                else if (static_cast<int>(gamma+0.5) >= 3)
                {
                  r=sqrt(sqrt(r));
                  g=sqrt(sqrt(g));
                  b=sqrt(sqrt(b));
                }
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_jet)
          {
            // map greyscale image using jet encoding

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v >= imin)
                {
                  if (v <= imax)
                  {
                    v=(v-imin)/irange;

                    if (gamma != 1.0)
                    {
                      // pow() can be extremly slow and linear lookup tables would be
                      // very big for data with higher radiometric depth, thats why we
                      // only allow a gamma with root of 2 and 4.

                      if (static_cast<int>(gamma+0.5) == 2)
                      {
                        v=sqrt(v);
                      }
                      else if (static_cast<int>(gamma+0.5) >= 3)
                      {
                        v=sqrt(sqrt(r));
                      }
                    }
                  }
                  else
                  {
                    v=1.05;
                  }
                }
                else
                {
                  v=-0.05;
                }

                v=v/1.15+0.1;
                r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
                g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
                b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_rainbow)
          {
            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v < imin)
                {
                  v=imin;
                }

                if (v > imax)
                {
                  v=imax;
                }

                // compute color

                double v1=v/rainbow_size;

                v1=6.0*(v1-floor(v1));

                int v0=static_cast<int>(v1);

                v1-=v0;

                switch (v0)
                {
                  case 0:
                    r=1.0;
                    g=v1;
                    break;

                  case 1:
                    r=1.0-v1;
                    g=1.0;
                    break;

                  case 2:
                    g=1.0;
                    b=v1;
                    break;

                  case 3:
                    g=1.0-v1;
                    b=1.0;
                    break;

                  case 4:
                    b=1.0;
                    r=v1;
                    break;

                  default:
                    b=1.0-v1;
                    r=1.0;
                    break;
                }

                // compute brightness

                v=1.6*(v-imin)/irange-0.8;

                if (v < 0)
                {
                  r*=v+1;
                  g*=v+1;
                  b*=v+1;
                }
                else
                {
                  r=(1-v)*r+v;
                  g=(1-v)*g+v;
                  b=(1-v)*b+v;
                }
              }

              rgb.set(i, k, 0, static_cast<int>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<int>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<int>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
        }

        while (i < rgb.getWidth())
        {
          rgb.set(i, k, 0, 0);
          rgb.set(i, k, 1, 0);
          rgb.set(i, k, 2, 0);

          i++;
        }
      }
    }